

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

LogMessage * __thiscall
google::protobuf::internal::LogMessage::operator<<(LogMessage *this,uint128 *value)

{
  LogMessage *in_RDI;
  ostringstream str;
  uint128 *in_stack_00000168;
  ostream *in_stack_00000170;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  protobuf::operator<<(in_stack_00000170,in_stack_00000168);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator+=((string *)&in_RDI->message_,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

LogMessage& LogMessage::operator<<(const uint128& value) {
  std::ostringstream str;
  str << value;
  message_ += str.str();
  return *this;
}